

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

LabelInstr * __thiscall Lowerer::EnsureEpilogueLabel(Lowerer *this)

{
  Instr *this_00;
  code *pcVar1;
  bool bVar2;
  JITTimeFunctionBody *this_01;
  undefined4 *puVar3;
  LabelInstr *pLVar4;
  
  this_01 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::IsCoroutine(this_01);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x387e,"(!this->m_func->GetJITFunctionBody()->IsCoroutine())",
                       "!this->m_func->GetJITFunctionBody()->IsCoroutine()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = this->m_func->m_exitInstr->m_prev;
  if ((this_00->m_kind != InstrKindProfiledLabel) && (this_00->m_kind != InstrKindLabel)) {
    pLVar4 = IR::LabelInstr::New(Label,this->m_func,false);
    pLVar4->m_name = L"Epilogue";
    IR::Instr::InsertAfter(this_00,&pLVar4->super_Instr);
    return pLVar4;
  }
  pLVar4 = IR::Instr::AsLabelInstr(this_00);
  return pLVar4;
}

Assistant:

IR::LabelInstr *
Lowerer::EnsureEpilogueLabel() const
{
    Assert(!this->m_func->GetJITFunctionBody()->IsCoroutine());
    IR::Instr* exitPrevInstr = this->m_func->m_exitInstr->m_prev;
    if (exitPrevInstr->IsLabelInstr())
    {
        return exitPrevInstr->AsLabelInstr();
    }
    else
    {
        IR::LabelInstr* epilogueLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, false);
        LABELNAMESET(epilogueLabel, "Epilogue");
        exitPrevInstr->InsertAfter(epilogueLabel);
        return epilogueLabel;
    }
}